

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

void __thiscall
cmFindLibraryHelper::RegexFromLiteral(cmFindLibraryHelper *this,string *out,string *in)

{
  pointer pcVar1;
  size_type sVar2;
  uint uVar3;
  size_type sVar4;
  
  pcVar1 = (in->_M_dataplus)._M_p;
  sVar2 = in->_M_string_length;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    uVar3 = (byte)pcVar1[sVar4] - 0x24;
    if ((uVar3 < 0x3b) && ((0x7800000080006f1U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
      std::__cxx11::string::append((char *)out);
    }
    std::__cxx11::string::push_back((char)out);
  }
  return;
}

Assistant:

void cmFindLibraryHelper::RegexFromLiteral(std::string& out,
                                           std::string const& in)
{
  for (char ch : in) {
    if (ch == '[' || ch == ']' || ch == '(' || ch == ')' || ch == '\\' ||
        ch == '.' || ch == '*' || ch == '+' || ch == '?' || ch == '-' ||
        ch == '^' || ch == '$') {
      out += "\\";
    }
#if defined(_WIN32) || defined(__APPLE__)
    out += static_cast<char>(tolower(ch));
#else
    out += ch;
#endif
  }
}